

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

Expression __thiscall cnn::expr::reshape(expr *this,Expression *x,Dim *d)

{
  pointer *pppNVar1;
  ComputationGraph *this_00;
  iterator __position;
  pointer pVVar2;
  pointer pVVar3;
  pointer pVVar4;
  Node *pNVar5;
  undefined8 extraout_RDX;
  Expression EVar6;
  initializer_list<cnn::VariableIndex> __l;
  VariableIndex new_node_index;
  allocator_type local_3d;
  VariableIndex local_3c;
  Node *local_38;
  VariableIndex local_2c;
  
  this_00 = x->pg;
  local_2c.t = (x->i).t;
  local_3c.t = (uint)((ulong)((long)(this_00->nodes).
                                    super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_00->nodes).
                                   super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
  pNVar5 = (Node *)operator_new(0x78);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_002a7c50;
  __l._M_len = 1;
  __l._M_array = &local_2c;
  std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::vector
            (&pNVar5->args,__l,&local_3d);
  (pNVar5->dim).nd = 0;
  (pNVar5->dim).bd = 1;
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_002a98e0;
  pVVar2 = *(pointer *)(d->d + 2);
  pVVar3 = *(pointer *)(d->d + 4);
  pVVar4 = *(pointer *)(d->d + 6);
  pNVar5[1]._vptr_Node = *(_func_int ***)d->d;
  pNVar5[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl
  .super__Vector_impl_data._M_start = pVVar2;
  pNVar5[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl
  .super__Vector_impl_data._M_finish = pVVar3;
  pNVar5[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = pVVar4;
  pNVar5[1].dim.d[0] = d->bd;
  __position._M_current =
       (this_00->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38 = pNVar5;
  if (__position._M_current ==
      (this_00->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cnn::Node*,std::allocator<cnn::Node*>>::_M_realloc_insert<cnn::Node*>
              ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)this_00,__position,&local_38);
  }
  else {
    *__position._M_current = pNVar5;
    pppNVar1 = &(this_00->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  ComputationGraph::set_dim_for_new_node(this_00,&local_3c);
  *(ComputationGraph **)this = this_00;
  *(uint *)(this + 8) = local_3c.t;
  EVar6._8_8_ = extraout_RDX;
  EVar6.pg = (ComputationGraph *)this;
  return EVar6;
}

Assistant:

Expression reshape(const Expression& x, const Dim& d) { return Expression(x.pg, x.pg->add_function<Reshape>({x.i}, d)); }